

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fse_compress.c
# Opt level: O0

size_t FSE_buildCTable_wksp
                 (FSE_CTable *ct,short *normalizedCounter,uint maxSymbolValue,uint tableLog,
                 void *workSpace,size_t wkspSize)

{
  short sVar1;
  uint uVar2;
  uint uVar3;
  byte bVar4;
  uint local_4ac;
  U32 minStatePlus;
  U32 maxBitsOut;
  uint s_1;
  uint total;
  BYTE s;
  U32 u_1;
  int freq;
  int nbOccurences;
  U32 symbol;
  U32 position;
  U32 u;
  U32 highThreshold;
  BYTE *tableSymbol;
  U32 cumul [257];
  U32 step;
  FSE_symbolCompressionTransform *symbolTT;
  void *FSCT;
  U16 *tableU16;
  void *ptr;
  U32 tableMask;
  U32 tableSize;
  size_t wkspSize_local;
  void *workSpace_local;
  uint tableLog_local;
  uint maxSymbolValue_local;
  short *normalizedCounter_local;
  FSE_CTable *ct_local;
  
  bVar4 = (byte)tableLog;
  uVar3 = 1 << (bVar4 & 0x1f);
  if (tableLog == 0) {
    local_4ac = 1;
  }
  else {
    local_4ac = uVar3 >> 1;
  }
  stack0xffffffffffffffa0 = ct + (ulong)local_4ac + 1;
  cumul[0xff] = (uVar3 >> 1) + (uVar3 >> 3) + 3;
  position = uVar3 - 1;
  if (wkspSize < (ulong)(1L << (bVar4 & 0x3f))) {
    ct_local = (FSE_CTable *)0xffffffffffffffd4;
  }
  else {
    *(short *)ct = (short)tableLog;
    *(short *)((long)ct + 2) = (short)maxSymbolValue;
    for (symbol = 1; symbol <= maxSymbolValue + 1; symbol = symbol + 1) {
      if (normalizedCounter[symbol - 1] == -1) {
        cumul[(ulong)symbol - 2] = cumul[(ulong)(symbol - 1) - 2] + 1;
        *(char *)((long)workSpace + (ulong)position) = (char)symbol + -1;
        position = position - 1;
      }
      else {
        cumul[(ulong)symbol - 2] =
             cumul[(ulong)(symbol - 1) - 2] + (int)normalizedCounter[symbol - 1];
      }
    }
    cumul[(ulong)(maxSymbolValue + 1) - 2] = uVar3 + 1;
    nbOccurences = 0;
    for (freq = 0; (uint)freq <= maxSymbolValue; freq = freq + 1) {
      sVar1 = normalizedCounter[(uint)freq];
      for (u_1 = 0; (int)u_1 < (int)sVar1; u_1 = u_1 + 1) {
        *(char *)((long)workSpace + (ulong)(uint)nbOccurences) = (char)freq;
        do {
          nbOccurences = nbOccurences + cumul[0xff] & uVar3 - 1;
        } while (position < (uint)nbOccurences);
      }
    }
    for (total = 0; total < uVar3; total = total + 1) {
      uVar2 = cumul[(ulong)*(byte *)((long)workSpace + (ulong)total) - 2];
      cumul[(ulong)*(byte *)((long)workSpace + (ulong)total) - 2] = uVar2 + 1;
      *(short *)((long)ct + (ulong)uVar2 * 2 + 4) = (short)uVar3 + (short)total;
    }
    maxBitsOut = 0;
    for (minStatePlus = 0; minStatePlus <= maxSymbolValue; minStatePlus = minStatePlus + 1) {
      sVar1 = normalizedCounter[minStatePlus];
      if (sVar1 == -1) {
LAB_0071b182:
        stack0xffffffffffffffa0[(ulong)minStatePlus * 2 + 1] =
             tableLog * 0x10000 - (1 << (bVar4 & 0x1f));
        stack0xffffffffffffffa0[(ulong)minStatePlus * 2] = maxBitsOut - 1;
        maxBitsOut = maxBitsOut + 1;
      }
      else if (sVar1 == 0) {
        stack0xffffffffffffffa0[(ulong)minStatePlus * 2 + 1] =
             (tableLog + 1) * 0x10000 - (1 << (bVar4 & 0x1f));
      }
      else {
        if (sVar1 == 1) goto LAB_0071b182;
        uVar3 = BIT_highbit32((int)normalizedCounter[minStatePlus] - 1);
        stack0xffffffffffffffa0[(ulong)minStatePlus * 2 + 1] =
             (tableLog - uVar3) * 0x10000 -
             ((int)normalizedCounter[minStatePlus] << ((byte)(tableLog - uVar3) & 0x1f));
        stack0xffffffffffffffa0[(ulong)minStatePlus * 2] =
             maxBitsOut - (int)normalizedCounter[minStatePlus];
        maxBitsOut = (int)normalizedCounter[minStatePlus] + maxBitsOut;
      }
    }
    ct_local = (FSE_CTable *)0x0;
  }
  return (size_t)ct_local;
}

Assistant:

size_t FSE_buildCTable_wksp(FSE_CTable* ct,
                      const short* normalizedCounter, unsigned maxSymbolValue, unsigned tableLog,
                            void* workSpace, size_t wkspSize)
{
    U32 const tableSize = 1 << tableLog;
    U32 const tableMask = tableSize - 1;
    void* const ptr = ct;
    U16* const tableU16 = ( (U16*) ptr) + 2;
    void* const FSCT = ((U32*)ptr) + 1 /* header */ + (tableLog ? tableSize>>1 : 1) ;
    FSE_symbolCompressionTransform* const symbolTT = (FSE_symbolCompressionTransform*) (FSCT);
    U32 const step = FSE_TABLESTEP(tableSize);
    U32 cumul[FSE_MAX_SYMBOL_VALUE+2];

    FSE_FUNCTION_TYPE* const tableSymbol = (FSE_FUNCTION_TYPE*)workSpace;
    U32 highThreshold = tableSize-1;

    /* CTable header */
    if (((size_t)1 << tableLog) * sizeof(FSE_FUNCTION_TYPE) > wkspSize) return ERROR(tableLog_tooLarge);
    tableU16[-2] = (U16) tableLog;
    tableU16[-1] = (U16) maxSymbolValue;
    assert(tableLog < 16);   /* required for threshold strategy to work */

    /* For explanations on how to distribute symbol values over the table :
     * http://fastcompression.blogspot.fr/2014/02/fse-distributing-symbol-values.html */

     #ifdef __clang_analyzer__
     memset(tableSymbol, 0, sizeof(*tableSymbol) * tableSize);   /* useless initialization, just to keep scan-build happy */
     #endif

    /* symbol start positions */
    {   U32 u;
        cumul[0] = 0;
        for (u=1; u <= maxSymbolValue+1; u++) {
            if (normalizedCounter[u-1]==-1) {  /* Low proba symbol */
                cumul[u] = cumul[u-1] + 1;
                tableSymbol[highThreshold--] = (FSE_FUNCTION_TYPE)(u-1);
            } else {
                cumul[u] = cumul[u-1] + normalizedCounter[u-1];
        }   }
        cumul[maxSymbolValue+1] = tableSize+1;
    }

    /* Spread symbols */
    {   U32 position = 0;
        U32 symbol;
        for (symbol=0; symbol<=maxSymbolValue; symbol++) {
            int nbOccurences;
            int const freq = normalizedCounter[symbol];
            for (nbOccurences=0; nbOccurences<freq; nbOccurences++) {
                tableSymbol[position] = (FSE_FUNCTION_TYPE)symbol;
                position = (position + step) & tableMask;
                while (position > highThreshold)
                    position = (position + step) & tableMask;   /* Low proba area */
        }   }

        assert(position==0);  /* Must have initialized all positions */
    }

    /* Build table */
    {   U32 u; for (u=0; u<tableSize; u++) {
        FSE_FUNCTION_TYPE s = tableSymbol[u];   /* note : static analyzer may not understand tableSymbol is properly initialized */
        tableU16[cumul[s]++] = (U16) (tableSize+u);   /* TableU16 : sorted by symbol order; gives next state value */
    }   }

    /* Build Symbol Transformation Table */
    {   unsigned total = 0;
        unsigned s;
        for (s=0; s<=maxSymbolValue; s++) {
            switch (normalizedCounter[s])
            {
            case  0:
                /* filling nonetheless, for compatibility with FSE_getMaxNbBits() */
                symbolTT[s].deltaNbBits = ((tableLog+1) << 16) - (1<<tableLog);
                break;

            case -1:
            case  1:
                symbolTT[s].deltaNbBits = (tableLog << 16) - (1<<tableLog);
                symbolTT[s].deltaFindState = total - 1;
                total ++;
                break;
            default :
                {
                    U32 const maxBitsOut = tableLog - BIT_highbit32 (normalizedCounter[s]-1);
                    U32 const minStatePlus = normalizedCounter[s] << maxBitsOut;
                    symbolTT[s].deltaNbBits = (maxBitsOut << 16) - minStatePlus;
                    symbolTT[s].deltaFindState = total - normalizedCounter[s];
                    total +=  normalizedCounter[s];
    }   }   }   }

#if 0  /* debug : symbol costs */
    DEBUGLOG(5, "\n --- table statistics : ");
    {   U32 symbol;
        for (symbol=0; symbol<=maxSymbolValue; symbol++) {
            DEBUGLOG(5, "%3u: w=%3i,   maxBits=%u, fracBits=%.2f",
                symbol, normalizedCounter[symbol],
                FSE_getMaxNbBits(symbolTT, symbol),
                (double)FSE_bitCost(symbolTT, tableLog, symbol, 8) / 256);
        }
    }
#endif

    return 0;
}